

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_TimedText.cpp
# Opt level: O3

h__Reader * __thiscall
AS_02::TimedText::MXFReader::h__Reader::MD_to_TimedText_TDesc
          (h__Reader *this,TimedTextDescriptor *TDesc)

{
  pointer pcVar1;
  undefined8 uVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  long lVar5;
  _List_node_base *p_Var6;
  ILogSink *this_00;
  undefined8 *in_RDX;
  long lVar7;
  uint uVar8;
  InterchangeObject *tmp_iobj;
  Result_t result;
  undefined1 local_100 [17];
  _List_node_base *p_Stack_ef;
  undefined **local_e0;
  bool local_d8;
  byte_t local_d7 [8];
  byte_t abStack_cf [55];
  int local_98 [26];
  
  pcVar1 = TDesc[8].EncodingName._M_dataplus._M_p;
  if (pcVar1 == (pointer)0x0) {
    __assert_fail("m_EssenceDescriptor",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
                  ,0x59,
                  "ASDCP::Result_t AS_02::TimedText::MXFReader::h__Reader::MD_to_TimedText_TDesc(TimedTextDescriptor &)"
                 );
  }
  *(undefined8 *)((long)&TDesc[8].RFC5646LanguageTagList._M_string_length + 4) = 0;
  *(undefined8 *)((long)&TDesc[8].RFC5646LanguageTagList.field_2 + 4) = 0;
  *in_RDX = *(undefined8 *)(pcVar1 + 0xf0);
  if (pcVar1[0x100] == '\x01') {
    if (*(ulong *)(pcVar1 + 0xf8) >> 0x20 != 0) {
      __assert_fail("TDescObj->ContainerDuration <= 0xFFFFFFFFL",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
                    ,0x60,
                    "ASDCP::Result_t AS_02::TimedText::MXFReader::h__Reader::MD_to_TimedText_TDesc(TimedTextDescriptor &)"
                   );
    }
    *(int *)(in_RDX + 1) = (int)*(ulong *)(pcVar1 + 0xf8);
  }
  uVar2 = *(undefined8 *)(pcVar1 + 0x181);
  *(undefined8 *)((long)in_RDX + 0xc) = *(undefined8 *)(pcVar1 + 0x179);
  *(undefined8 *)((long)in_RDX + 0x14) = uVar2;
  std::__cxx11::string::_M_assign((string *)(in_RDX + 4));
  std::__cxx11::string::_M_assign((string *)(in_RDX + 8));
  lVar7 = *(long *)(pcVar1 + 200);
  Kumu::Result_t::Result_t((Result_t *)local_98,(Result_t *)Kumu::RESULT_OK);
  if ((lVar7 != *(long *)(pcVar1 + 0xd0)) && (-1 < local_98[0])) {
    do {
      ASDCP::MXF::OP1aHeader::GetMDObjectByID
                ((UUID *)local_100,(InterchangeObject **)(TDesc->AssetID + 0xc));
      Kumu::Result_t::operator=((Result_t *)local_98,(Result_t *)local_100);
      Kumu::Result_t::~Result_t((Result_t *)local_100);
      p_Var4 = p_Ram00000000000000b1;
      p_Var3 = p_Ram00000000000000a9;
      if (local_98[0] < 0) {
        this_00 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error(this_00,"Broken sub-descriptor link\n");
        Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
        goto LAB_0014c6ba;
      }
      lVar5 = std::__cxx11::string::find((char *)0xc8,0x15b04b,0);
      uVar8 = 2;
      if (lVar5 == -1) {
        lVar5 = std::__cxx11::string::find((char *)0xc8,0x15b2cc,0);
        if (lVar5 == -1) {
          lVar5 = std::__cxx11::string::find((char *)0xc8,0x15b2e3,0);
          if (lVar5 == -1) {
            lVar5 = std::__cxx11::string::find((char *)0xc8,0x15b041,0);
            uVar8 = (uint)(lVar5 != -1);
          }
        }
      }
      p_Var6 = (_List_node_base *)operator_new(0x28);
      p_Var6[1]._M_next = p_Var3;
      p_Var6[1]._M_prev = p_Var4;
      *(uint *)&p_Var6[2]._M_next = uVar8;
      std::__detail::_List_node_base::_M_hook(p_Var6);
      in_RDX[0xe] = in_RDX[0xe] + 1;
      local_100[8] = uRam00000000000000a8;
      local_100._9_8_ = p_Ram00000000000000a9;
      p_Stack_ef = p_Ram00000000000000b1;
      local_100._0_8_ = &PTR__IArchive_0016b2b8;
      local_d8 = *(bool *)(lVar7 + 8);
      local_d7 = *(byte_t (*) [8])(lVar7 + 9);
      abStack_cf._0_8_ = *(undefined8 *)(lVar7 + 0x11);
      local_e0 = &PTR__IArchive_0016b2b8;
      std::
      _Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,Kumu::UUID>,std::_Select1st<std::pair<Kumu::UUID_const,Kumu::UUID>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,Kumu::UUID>>>
      ::_M_insert_unique<std::pair<Kumu::UUID_const,Kumu::UUID>>
                ((_Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,Kumu::UUID>,std::_Select1st<std::pair<Kumu::UUID_const,Kumu::UUID>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,Kumu::UUID>>>
                  *)&TDesc[8].EncodingName._M_string_length,
                 (pair<const_Kumu::UUID,_Kumu::UUID> *)local_100);
      lVar7 = lVar7 + 0x20;
    } while ((lVar7 != *(long *)(pcVar1 + 0xd0)) && (-1 < local_98[0]));
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)local_98);
LAB_0014c6ba:
  Kumu::Result_t::~Result_t((Result_t *)local_98);
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::TimedText::MXFReader::h__Reader::MD_to_TimedText_TDesc(TimedTextDescriptor& TDesc)
{
  assert(m_EssenceDescriptor);
  memset(&m_TDesc.AssetID, 0, UUIDlen);
  ASDCP::MXF::TimedTextDescriptor* TDescObj = (ASDCP::MXF::TimedTextDescriptor*)m_EssenceDescriptor;

  TDesc.EditRate = TDescObj->SampleRate;
  if ( ! TDescObj->ContainerDuration.empty() )
    {
      assert(TDescObj->ContainerDuration <= 0xFFFFFFFFL);
      TDesc.ContainerDuration = (ui32_t) TDescObj->ContainerDuration;
    }
  memcpy(TDesc.AssetID, TDescObj->ResourceID.Value(), UUIDlen);
  TDesc.NamespaceName = TDescObj->NamespaceURI;
  TDesc.EncodingName = TDescObj->UCSEncoding;

  Array<Kumu::UUID>::const_iterator sdi = TDescObj->SubDescriptors.begin();
  TimedTextResourceSubDescriptor* DescObject = 0;
  Result_t result = RESULT_OK;

  for ( ; sdi != TDescObj->SubDescriptors.end() && KM_SUCCESS(result); sdi++ )
    {
      InterchangeObject* tmp_iobj = 0;
      result = m_HeaderPart.GetMDObjectByID(*sdi, &tmp_iobj);
      DescObject = static_cast<TimedTextResourceSubDescriptor*>(tmp_iobj);

      if ( KM_SUCCESS(result) )
	{
	  TimedTextResourceDescriptor TmpResource;
	  memcpy(TmpResource.ResourceID, DescObject->AncillaryResourceID.Value(), UUIDlen);

	  if ( DescObject->MIMEMediaType.find("application/x-font-opentype") != std::string::npos
	       || DescObject->MIMEMediaType.find("application/x-opentype") != std::string::npos
	       || DescObject->MIMEMediaType.find("font/opentype") != std::string::npos )
	    {
	      TmpResource.Type = ASDCP::TimedText::MT_OPENTYPE;
	    }
	  else if ( DescObject->MIMEMediaType.find("image/png") != std::string::npos )
	    {
	      TmpResource.Type = ASDCP::TimedText::MT_PNG;
	    }
	  else
	    {
	      TmpResource.Type = ASDCP::TimedText::MT_BIN;
	    }

	  TDesc.ResourceList.push_back(TmpResource);
	  m_ResourceMap.insert(ResourceMap_t::value_type(DescObject->AncillaryResourceID, *sdi));
	}
      else
	{
	  DefaultLogSink().Error("Broken sub-descriptor link\n");
	  return RESULT_FORMAT;
	}
    }

  return result;
}